

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall ON_DimStyle::SetMaskColor(ON_DimStyle *this,ON_Color color)

{
  ON_TextMask *__src;
  undefined1 local_40 [8];
  ON_TextMask text_mask;
  ON_DimStyle *this_local;
  ON_Color color_local;
  
  text_mask.m_content_hash.m_digest._12_8_ = this;
  __src = TextMask(this);
  memcpy(local_40,__src,0x28);
  ON_TextMask::SetMaskColor((ON_TextMask *)local_40,color);
  Internal_SetTextMask(this,(ON_TextMask *)local_40);
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,MaskColor);
  return;
}

Assistant:

void ON_DimStyle::SetMaskColor(ON_Color color)
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  ON_TextMask text_mask = TextMask();
  text_mask.SetMaskColor(color);
  Internal_SetTextMask(text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::MaskColor);
}